

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::TestCaseTracking::TrackerBase::name_abi_cxx11_(TrackerBase *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x10));
  return in_RDI;
}

Assistant:

virtual std::string name() const CATCH_OVERRIDE {
            return m_name;
        }